

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::EmitSnapFunctionBodyScopeChain
               (SnapFunctionBodyScopeChain *scopeChain,FileWriter *writer)

{
  uint local_1c;
  uint32 i;
  FileWriter *writer_local;
  SnapFunctionBodyScopeChain *scopeChain_local;
  
  (*writer->_vptr_FileWriter[6])(writer,0);
  FileWriter::WriteLengthValue(writer,scopeChain->ScopeCount,NoSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (local_1c = 0; local_1c < scopeChain->ScopeCount; local_1c = local_1c + 1) {
    (*writer->_vptr_FileWriter[0x12])
              (writer,scopeChain->ScopeArray[local_1c],(ulong)(local_1c != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapFunctionBodyScopeChain(const SnapFunctionBodyScopeChain& scopeChain, FileWriter* writer)
        {
            writer->WriteRecordStart();

            writer->WriteLengthValue(scopeChain.ScopeCount);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < scopeChain.ScopeCount; ++i)
            {
                writer->WriteNakedAddr(scopeChain.ScopeArray[i], (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteRecordEnd();
        }